

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O1

void __thiscall
ResourcesDictionary::AddImageXObjectMapping
          (ResourcesDictionary *this,PDFImageXObject *inImageXObject,string *inImageXObjectName)

{
  _Rb_tree_header *p_Var1;
  ObjectIDType OVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  OVar2 = PDFImageXObject::GetImageObjectID(inImageXObject);
  p_Var1 = &(this->mXObjects)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < OVar2]) {
    if (*(ulong *)(p_Var4 + 1) >= OVar2) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, OVar2 < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    std::__cxx11::string::_M_assign((string *)&p_Var4[1]._M_parent);
    return;
  }
  AddImageXObjectMappingWithName(this,inImageXObject,inImageXObjectName);
  return;
}

Assistant:

void ResourcesDictionary::AddImageXObjectMapping(PDFImageXObject* inImageXObject, const std::string& inImageXObjectName)
{
	ObjectIDTypeToStringMap::iterator it = mXObjects.find(inImageXObject->GetImageObjectID());

	if(it == mXObjects.end())
		AddImageXObjectMappingWithName(inImageXObject,inImageXObjectName);
	else
		it->second = inImageXObjectName;
}